

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

natwm_error parser_create_variable(parser *parser)

{
  config_value *local_30;
  config_value *value;
  char *key;
  parser *ppStack_18;
  natwm_error err;
  parser *parser_local;
  
  ppStack_18 = parser;
  parser_increment(parser);
  key._4_4_ = 0x20;
  value = (config_value *)0x0;
  local_30 = (config_value *)0x0;
  key._4_4_ = parser_read_item(ppStack_18,(char **)&value,&local_30);
  parser_local._4_4_ = key._4_4_;
  if (key._4_4_ == NO_ERROR) {
    key._4_4_ = map_insert(ppStack_18->variables,value,local_30);
    if (key._4_4_ == NO_ERROR) {
      parser_local._4_4_ = NO_ERROR;
    }
    else {
      free(value);
      config_value_destroy(local_30);
      parser_local._4_4_ = key._4_4_;
    }
  }
  return parser_local._4_4_;
}

Assistant:

enum natwm_error parser_create_variable(struct parser *parser)
{
        // Skip VARIABLE_START
        parser_increment(parser);

        enum natwm_error err = GENERIC_ERROR;
        char *key = NULL;
        struct config_value *value = NULL;

        err = parser_read_item(parser, &key, &value);

        if (err != NO_ERROR) {
                return err;
        }

        err = map_insert(parser->variables, key, value);

        if (err != NO_ERROR) {
                free(key);
                config_value_destroy(value);

                return err;
        }

        return NO_ERROR;
}